

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O1

void __thiscall CSocekt::initconnection(CSocekt *this)

{
  size_t *psVar1;
  CMemory *this_00;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int iVar4;
  
  this_00 = CMemory::GetInstance();
  if (0 < this->m_worker_connections) {
    iVar4 = 0;
    do {
      p_Var2 = (_List_node_base *)CMemory::AllocMemory(this_00,0x120,true);
      p_Var2->_M_next = (_List_node_base *)&PTR__flyd_connection_s_00125b00;
      *(undefined4 *)&p_Var2[0xd]._M_prev = 0;
      pthread_mutex_init((pthread_mutex_t *)(p_Var2 + 0xb),(pthread_mutexattr_t *)0x0);
      *(undefined4 *)&p_Var2[0xe]._M_next = 0;
      *(undefined4 *)((long)&p_Var2[0x11]._M_prev + 4) = 0;
      p_Var2[2]._M_next = (_List_node_base *)0x1;
      *(undefined4 *)&p_Var2->_M_prev = 0xffffffff;
      *(undefined1 *)((long)&p_Var2[6]._M_prev + 4) = 0;
      p_Var2[8]._M_prev = (_List_node_base *)((long)&p_Var2[6]._M_prev + 5);
      *(undefined4 *)&p_Var2[9]._M_next = 8;
      p_Var2[9]._M_prev = (_List_node_base *)0x0;
      LOCK();
      *(undefined4 *)&p_Var2[0xe]._M_next = 0;
      UNLOCK();
      p_Var2[0xe]._M_prev = (_List_node_base *)0x0;
      *(undefined4 *)&p_Var2[6]._M_prev = 0;
      p_Var3 = (_List_node_base *)time((time_t *)0x0);
      p_Var2[0x10]._M_prev = p_Var3;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->m_connectionList).
                super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->m_freeconnectionList).
                super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_worker_connections);
  }
  LOCK();
  (this->m_free_connection_n).value_ =
       (int)(this->m_connectionList).
            super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
            _M_node._M_size;
  UNLOCK();
  LOCK();
  (this->m_total_connection_n).value_ =
       (int)(this->m_connectionList).
            super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
            _M_node._M_size;
  UNLOCK();
  return;
}

Assistant:

void CSocekt::initconnection()
{
    lp_connection_t p_Conn;
    CMemory *p_memory = CMemory::GetInstance();   

    int ilenconnpool = sizeof(flyd_connection_t);    
    for(int i = 0; i < m_worker_connections; ++i) //先创建这么多个连接，后续不够再增加
    {
        p_Conn = (lp_connection_t)p_memory->AllocMemory(ilenconnpool,true); //清理内存 , 因为这里分配内存new char，无法执行构造函数，所以如下：
        //手工调用构造函数，因为AllocMemory里无法调用构造函数
        //定位new就是先分配了内存，再把地址p_Conn交给flyd_connection_t
        p_Conn = new(p_Conn) flyd_connection_t();  //定位new【不懂请百度】，释放则显式调用p_Conn->~ngx_connection_t();		
        p_Conn->GetOneToUse();
        m_connectionList.push_back(p_Conn);     //所有链接【不管是否空闲】都放在这个list
        m_freeconnectionList.push_back(p_Conn); //空闲连接会放在这个list
    } //end for
    m_free_connection_n.getAndSet(m_connectionList.size());
    m_total_connection_n.getAndSet(m_connectionList.size());
    return;
}